

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

BOOL __thiscall
Js::JavascriptProxy::GetPropertyDescriptorTrap
          (JavascriptProxy *this,PropertyId propertyId,PropertyDescriptor *resultDescriptor,
          ScriptContext *requestContext)

{
  ImplicitCallFlags IVar1;
  ScriptContext *scriptContext;
  ThreadContext *this_00;
  Type *pTVar2;
  long *plVar3;
  code *pcVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  BOOL BVar9;
  Attributes attributes;
  BOOL BVar10;
  BOOL BVar11;
  RecyclableObject *pRVar12;
  RecyclableObject *obj;
  undefined4 *puVar13;
  JavascriptFunction *function;
  Var aValue;
  RecyclableObject *this_01;
  PropertyDescriptor *this_02;
  Type typeId;
  undefined1 local_80 [8];
  PropertyDescriptor targetDescriptor;
  
  scriptContext =
       (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
       super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
  this_00 = requestContext->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  targetDescriptor._40_8_ = resultDescriptor;
  pRVar12 = MarshalHandler(this,requestContext);
  if (pRVar12 == (RecyclableObject *)0x0) {
    bVar6 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar6) {
      return 0;
    }
    JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea15,L"getOwnPropertyDescriptor");
  }
  obj = MarshalTarget(this,requestContext);
  iVar8 = (**(code **)(**(long **)((this->super_DynamicObject).super_RecyclableObject.type.ptr + 1)
                      + 0x30))();
  if ((iVar8 != 0) &&
     (pTVar2 = (this->super_DynamicObject).super_RecyclableObject.type.ptr,
     plVar3 = *(long **)(pTVar2 + 1),
     iVar8 = (**(code **)(*plVar3 + 0x48))
                       (plVar3,(((pTVar2->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                               scriptContext.ptr,0), iVar8 != 7)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0xdc,
                                "((static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyCount() == 0 || (static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyId(GetScriptContext(), 0) == InternalPropertyIds::WeakMapKeyMap)"
                                ,
                                "(static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyCount() == 0 || (static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyId(GetScriptContext(), 0) == InternalPropertyIds::WeakMapKeyMap"
                               );
    if (!bVar6) goto LAB_00ba444d;
    *puVar13 = 0;
  }
  function = GetMethodHelper(this,0xa4,requestContext);
  if ((function == (JavascriptFunction *)0x0) ||
     (bVar6 = ScriptContext::IsHeapEnumInProgress
                        ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->
                           javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr),
     bVar6)) {
    *(undefined1 *)(targetDescriptor._40_8_ + 0x29) = 0;
    BVar9 = JavascriptOperators::GetOwnPropertyDescriptor
                      (obj,propertyId,requestContext,(PropertyDescriptor *)targetDescriptor._40_8_);
    return BVar9;
  }
  aValue = GetName(requestContext,propertyId);
  bVar6 = VarIs<Js::JavascriptString>(aValue);
  if ((!bVar6) && (bVar6 = VarIs<Js::JavascriptSymbol>(aValue), !bVar6)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0xea,
                                "(VarIs<JavascriptString>(propertyName) || VarIs<JavascriptSymbol>(propertyName))"
                                ,
                                "VarIs<JavascriptString>(propertyName) || VarIs<JavascriptSymbol>(propertyName)"
                               );
    if (!bVar6) goto LAB_00ba444d;
    *puVar13 = 0;
  }
  bVar6 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_80 = (undefined1  [8])this_00;
  targetDescriptor.Value.ptr = function;
  targetDescriptor.Getter.ptr = pRVar12;
  targetDescriptor.Setter.ptr = obj;
  targetDescriptor.originalVar.ptr = aValue;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar7 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar7) {
    pRVar12 = (RecyclableObject *)
              GetPropertyDescriptorTrap::anon_class_40_5_440632d1::operator()
                        ((anon_class_40_5_440632d1 *)local_80);
    bVar7 = ThreadContext::IsOnStack(pRVar12);
    if (bVar7) {
LAB_00ba4144:
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    }
  }
  else if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) == DisableImplicitNoFlag) {
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      pRVar12 = (RecyclableObject *)
                GetPropertyDescriptorTrap::anon_class_40_5_440632d1::operator()
                          ((anon_class_40_5_440632d1 *)local_80);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
    }
    else {
      pRVar12 = (RecyclableObject *)
                GetPropertyDescriptorTrap::anon_class_40_5_440632d1::operator()
                          ((anon_class_40_5_440632d1 *)local_80);
      bVar7 = ThreadContext::IsOnStack(pRVar12);
      if (bVar7) goto LAB_00ba4144;
    }
  }
  else {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
    pRVar12 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                    javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
              undefinedValue.ptr;
  }
  uVar5 = targetDescriptor._40_8_;
  this_00->reentrancySafeOrHandled = bVar6;
  if (pRVar12 == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar6) goto LAB_00ba444d;
    *puVar13 = 0;
  }
  bVar6 = TaggedInt::Is(pRVar12);
  if (bVar6) {
    typeId = TypeIds_FirstNumberType;
  }
  else {
    if ((ulong)pRVar12 >> 0x32 != 0) {
      typeId = TypeIds_Number;
      goto LAB_00ba4303;
    }
    this_01 = UnsafeVarTo<Js::RecyclableObject>(pRVar12);
    if (this_01 == (RecyclableObject *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
      if (!bVar6) goto LAB_00ba444d;
      *puVar13 = 0;
    }
    typeId = ((this_01->type).ptr)->typeId;
    if ((0x57 < (int)typeId) && (BVar9 = RecyclableObject::IsExternal(this_01), BVar9 == 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                  ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                  "GetTypeId aValue has invalid TypeId");
      if (!bVar6) {
LAB_00ba444d:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar13 = 0;
    }
  }
LAB_00ba4303:
  bVar6 = StaticType::Is(typeId);
  if (typeId != TypeIds_Undefined && bVar6) {
    JavascriptError::ThrowTypeError(requestContext,-0x7ff5ec71,L"getOwnPropertyDescriptor");
  }
  this_02 = (PropertyDescriptor *)local_80;
  PropertyDescriptor::PropertyDescriptor(this_02);
  BVar9 = JavascriptOperators::GetOwnPropertyDescriptor(obj,propertyId,requestContext,this_02);
  if (typeId == TypeIds_Undefined) {
    if ((BVar9 == 0) ||
       ((bVar6 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_80), bVar6 &&
        (iVar8 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
                   _vptr_IRecyclerVisitedObject[0x33])(), iVar8 != 0)))) {
      return 0;
    }
  }
  else {
    iVar8 = (*(obj->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x33])(obj);
    BVar10 = JavascriptOperators::ToPropertyDescriptor
                       (pRVar12,(PropertyDescriptor *)uVar5,requestContext);
    uVar5 = targetDescriptor._40_8_;
    if ((iVar8 == 0) || (BVar10 != 0)) {
      JavascriptOperators::CompletePropertyDescriptor
                ((PropertyDescriptor *)targetDescriptor._40_8_,(PropertyDescriptor *)0x0,
                 requestContext);
      if (BVar9 == 0) {
        this_02 = (PropertyDescriptor *)0x0;
      }
      BVar11 = JavascriptOperators::IsCompatiblePropertyDescriptor
                         ((PropertyDescriptor *)uVar5,this_02,iVar8 != 0,true,requestContext);
      if ((BVar11 != 0) &&
         ((bVar6 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)uVar5), bVar6 ||
          ((BVar9 != 0 &&
           (bVar6 = PropertyDescriptor::IsConfigurable((PropertyDescriptor *)local_80), !bVar6))))))
      {
        *(undefined1 *)(uVar5 + 0x29) = 1;
        return BVar10;
      }
    }
  }
  JavascriptError::ThrowTypeError(requestContext,-0x7ff5ea14,L"getOwnPropertyDescriptor");
}

Assistant:

BOOL JavascriptProxy::GetPropertyDescriptorTrap(PropertyId propertyId, PropertyDescriptor* resultDescriptor, ScriptContext* requestContext)
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = requestContext->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        //1. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        //2. If handler is null, then throw a TypeError exception.
        if (handlerObj == nullptr)
        {
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(requestContext, JSERR_ErrorOnRevokedProxy, _u("getOwnPropertyDescriptor"));
        }
        //3. Let target be the value of the[[ProxyTarget]] internal slot of O.
        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        Assert((static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyCount() == 0 ||
            (static_cast<DynamicType*>(GetType()))->GetTypeHandler()->GetPropertyId(GetScriptContext(), 0) == InternalPropertyIds::WeakMapKeyMap);

        JavascriptFunction* gOPDMethod = GetMethodHelper(PropertyIds::getOwnPropertyDescriptor, requestContext);

        //7. If trap is undefined, then
        //    a.Return the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        if (nullptr == gOPDMethod || GetScriptContext()->IsHeapEnumInProgress())
        {
            resultDescriptor->SetFromProxy(false);
            return JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, resultDescriptor);
        }

        Var propertyName = GetName(requestContext, propertyId);

        Assert(VarIs<JavascriptString>(propertyName) || VarIs<JavascriptSymbol>(propertyName));
        //8. Let trapResultObj be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target and P.
        //9. ReturnIfAbrupt(trapResultObj).
        //10. If Type(trapResultObj) is neither Object nor Undefined, then throw a TypeError exception.

        Var getResult = threadContext->ExecuteImplicitCall(gOPDMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, gOPDMethod, CallInfo(CallFlags_Value, 3), handlerObj, targetObj, propertyName);
        });

        TypeId getResultTypeId = JavascriptOperators::GetTypeId(getResult);
        if (StaticType::Is(getResultTypeId) && getResultTypeId != TypeIds_Undefined)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_NeedObject, _u("getOwnPropertyDescriptor"));
        }
        //11. Let targetDesc be the result of calling the[[GetOwnProperty]] internal method of target with argument P.
        //12. ReturnIfAbrupt(targetDesc).
        PropertyDescriptor targetDescriptor;
        BOOL hasProperty = JavascriptOperators::GetOwnPropertyDescriptor(targetObj, propertyId, requestContext, &targetDescriptor);

        //13. If trapResultObj is undefined, then
        //a.If targetDesc is undefined, then return undefined.
        //b.If targetDesc.[[Configurable]] is false, then throw a TypeError exception.
        //c.Let extensibleTarget be the result of IsExtensible(target).
        //d.ReturnIfAbrupt(extensibleTarget).
        //e.If ToBoolean(extensibleTarget) is false, then throw a TypeError exception.
        //f.Return undefined.
        if (getResultTypeId == TypeIds_Undefined)
        {
            if (!hasProperty)
            {
                return FALSE;
            }
            if (!targetDescriptor.IsConfigurable())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
            }

            // do not use "target" here, the trap may have caused it to change
            if (!targetObj->IsExtensible())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
            }

            return FALSE;
        }

        //14. Let extensibleTarget be the result of IsExtensible(target).
        //15. ReturnIfAbrupt(extensibleTarget).
        //16. Let resultDesc be ToPropertyDescriptor(trapResultObj).
        //17. ReturnIfAbrupt(resultDesc).
        //18. Call CompletePropertyDescriptor(resultDesc, targetDesc).
        //19. Let valid be the result of IsCompatiblePropertyDescriptor(extensibleTarget, resultDesc, targetDesc).
        //20. If valid is false, then throw a TypeError exception.
        //21. If resultDesc.[[Configurable]] is false, then
        //a.If targetDesc is undefined or targetDesc.[[Configurable]] is true, then
        //i.Throw a TypeError exception.
        //22. Return resultDesc.

        // do not use "target" here, the trap may have caused it to change
        BOOL isTargetExtensible = targetObj->IsExtensible();
        BOOL toProperty = JavascriptOperators::ToPropertyDescriptor(getResult, resultDescriptor, requestContext);
        if (!toProperty && isTargetExtensible)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
        }

        JavascriptOperators::CompletePropertyDescriptor(resultDescriptor, nullptr, requestContext);
        if (!JavascriptOperators::IsCompatiblePropertyDescriptor(*resultDescriptor, hasProperty ? &targetDescriptor : nullptr, !!isTargetExtensible, true, requestContext))
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
        }
        if (!resultDescriptor->IsConfigurable())
        {
            if (!hasProperty || targetDescriptor.IsConfigurable())
            {
                JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("getOwnPropertyDescriptor"));
            }
        }
        resultDescriptor->SetFromProxy(true);
        return toProperty;
    }